

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

void __thiscall
ON_Xform::Rotation(ON_Xform *this,double sin_angle,double cos_angle,ON_3dVector axis,
                  ON_3dPoint center)

{
  bool bVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ON_2dVector cs;
  
  pdVar3 = (double *)&IdentityTransformation;
  pdVar4 = (double *)this;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar4 = pdVar4 + 1;
  }
  dVar5 = ABS(cos_angle);
  if ((0.9999999850988388 <= ABS(sin_angle)) && (dVar5 <= 1.490116119385e-08)) {
LAB_006773a7:
    cos_angle = 0.0;
    sin_angle = *(double *)(&DAT_006924c0 + (ulong)(sin_angle < 0.0) * 8);
    goto LAB_006773c0;
  }
  if ((1.490116119385e-08 < ABS(sin_angle)) || (dVar5 < 0.9999999850988388)) {
    if (1.490116119385e-08 < ABS(cos_angle * cos_angle + sin_angle * sin_angle + -1.0)) {
      ON_2dVector::ON_2dVector(&cs,cos_angle,sin_angle);
      bVar1 = ON_2dVector::Unitize(&cs);
      if (bVar1) {
        dVar5 = ABS(cs.x);
        cos_angle = cs.x;
        sin_angle = cs.y;
        goto LAB_006776a8;
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xform.cpp"
                 ,0x838,"","sin_angle and cos_angle are both zero.");
      sin_angle = 0.0;
      cos_angle = 1.0;
    }
    else {
LAB_006776a8:
      if ((0.9999999999999998 < dVar5) || (ABS(sin_angle) < 2.220446049250313e-16))
      goto LAB_006776cc;
      if ((dVar5 < 2.220446049250313e-16) || (0.9999999999999998 < ABS(sin_angle)))
      goto LAB_006773a7;
    }
  }
  else {
LAB_006776cc:
    sin_angle = 0.0;
    cos_angle = *(double *)(&DAT_006924c0 + (ulong)(cos_angle < 0.0) * 8);
  }
  if ((((sin_angle == 0.0) && (!NAN(sin_angle))) && (cos_angle == 1.0)) && (!NAN(cos_angle))) {
    return;
  }
LAB_006773c0:
  dVar5 = 1.0 - cos_angle;
  cs.x = axis.x;
  cs.y = axis.y;
  dVar6 = ON_3dVector::LengthSquared((ON_3dVector *)&cs);
  if (2.220446049250313e-16 < ABS(dVar6 + -1.0)) {
    ON_3dVector::Unitize((ON_3dVector *)&cs);
  }
  dVar10 = cs.x * cs.x * dVar5 + cos_angle;
  dVar11 = cs.x * cs.y * dVar5 + -axis.z * sin_angle;
  this->m_xform[0][0] = dVar10;
  this->m_xform[0][1] = dVar11;
  dVar6 = cs.x * cs.y * dVar5 + sin_angle * axis.z;
  dVar7 = cs.y * cs.y * dVar5 + cos_angle;
  this->m_xform[1][0] = dVar6;
  this->m_xform[1][1] = dVar7;
  dVar13 = axis.z * cs.x * dVar5 + sin_angle * cs.y;
  this->m_xform[0][2] = dVar13;
  dVar12 = axis.z * cs.y * dVar5 - sin_angle * cs.x;
  this->m_xform[1][2] = dVar12;
  dVar8 = axis.z * cs.x * dVar5 + -cs.y * sin_angle;
  dVar9 = axis.z * cs.y * dVar5 + cs.x * sin_angle;
  this->m_xform[2][0] = dVar8;
  this->m_xform[2][1] = dVar9;
  dVar5 = axis.z * axis.z * dVar5 + cos_angle;
  this->m_xform[2][2] = dVar5;
  if ((((center.x != 0.0) || (NAN(center.x))) ||
      ((center.y != 0.0 || ((NAN(center.y) || (center.z != 0.0)))))) || (NAN(center.z))) {
    this->m_xform[0][3] = -(dVar13 * center.z + (dVar10 + -1.0) * center.x + dVar11 * center.y);
    this->m_xform[1][3] = -(dVar12 * center.z + dVar6 * center.x + (dVar7 + -1.0) * center.y);
    this->m_xform[2][3] = -((dVar5 + -1.0) * center.z + dVar8 * center.x + dVar9 * center.y);
  }
  this->m_xform[3][2] = 0.0;
  this->m_xform[3][0] = 0.0;
  this->m_xform[3][1] = 0.0;
  this->m_xform[3][3] = 1.0;
  return;
}

Assistant:

void ON_Xform::Rotation(  
        double sin_angle,
        double cos_angle,
        ON_3dVector axis,
        ON_3dPoint center
        )
{
  *this = ON_Xform::IdentityTransformation;

  for(;;)
  {
    // 29 June 2005 Dale Lear
    //     Kill noise in input
    if ( fabs(sin_angle) >= 1.0-ON_SQRT_EPSILON && fabs(cos_angle) <= ON_SQRT_EPSILON )
    {
      cos_angle = 0.0;
      sin_angle = (sin_angle < 0.0) ? -1.0 : 1.0; 
      break;
    }
    
    if ( fabs(cos_angle) >= 1.0-ON_SQRT_EPSILON && fabs(sin_angle) <= ON_SQRT_EPSILON )
    {
      cos_angle = (cos_angle < 0.0) ? -1.0 : 1.0; 
      sin_angle = 0.0;
      break;
    }
    
    if ( fabs(cos_angle*cos_angle + sin_angle*sin_angle - 1.0) > ON_SQRT_EPSILON )
    {
      ON_2dVector cs(cos_angle,sin_angle);
      if ( cs.Unitize() )
      {
        cos_angle = cs.x;
        sin_angle = cs.y;
        // no break here
      }
      else
      {
        ON_ERROR("sin_angle and cos_angle are both zero.");
        cos_angle = 1.0;
        sin_angle = 0.0;
        break;
      }
    }

    if ( fabs(cos_angle) > 1.0-ON_EPSILON || fabs(sin_angle) < ON_EPSILON )
    {
      cos_angle = (cos_angle < 0.0) ? -1.0 : 1.0; 
      sin_angle = 0.0;
      break;
    }

    if ( fabs(sin_angle) > 1.0-ON_EPSILON || fabs(cos_angle) < ON_EPSILON )
    {
      cos_angle = 0.0;
      sin_angle = (sin_angle < 0.0) ? -1.0 : 1.0; 
      break;
    }

    break;
  }

  if (sin_angle != 0.0 || cos_angle != 1.0) 
  {
    const double one_minus_cos_angle = 1.0 - cos_angle;
    ON_3dVector a = axis;
    if ( fabs(a.LengthSquared() - 1.0) >  ON_EPSILON )
      a.Unitize();

    m_xform[0][0] = a.x*a.x*one_minus_cos_angle + cos_angle;
    m_xform[0][1] = a.x*a.y*one_minus_cos_angle - a.z*sin_angle;
    m_xform[0][2] = a.x*a.z*one_minus_cos_angle + a.y*sin_angle;

    m_xform[1][0] = a.y*a.x*one_minus_cos_angle + a.z*sin_angle;
    m_xform[1][1] = a.y*a.y*one_minus_cos_angle + cos_angle;
    m_xform[1][2] = a.y*a.z*one_minus_cos_angle - a.x*sin_angle;

    m_xform[2][0] = a.z*a.x*one_minus_cos_angle - a.y*sin_angle;
    m_xform[2][1] = a.z*a.y*one_minus_cos_angle + a.x*sin_angle;
    m_xform[2][2] = a.z*a.z*one_minus_cos_angle + cos_angle;

    if ( center.x != 0.0 || center.y != 0.0 || center.z != 0.0 ) {
      m_xform[0][3] = -((m_xform[0][0]-1.0)*center.x + m_xform[0][1]*center.y + m_xform[0][2]*center.z);
      m_xform[1][3] = -(m_xform[1][0]*center.x + (m_xform[1][1]-1.0)*center.y + m_xform[1][2]*center.z);
      m_xform[2][3] = -(m_xform[2][0]*center.x + m_xform[2][1]*center.y + (m_xform[2][2]-1.0)*center.z);
    }

    m_xform[3][0] = m_xform[3][1] = m_xform[3][2] = 0.0;
    m_xform[3][3] = 1.0;
  }
}